

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

shared_ptr<helics::Core>
helics::CoreFactory::FindOrCreate
          (CoreType type,string_view coreName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  element_type *peVar1;
  string_view name;
  string_view name_00;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 in_register_0000003c;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 *in_R8;
  string_view name_01;
  shared_ptr<helics::Core> sVar4;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> _StackY_58;
  pointer local_48;
  pointer pbStackY_40;
  pointer in_stack_ffffffffffffffc8;
  pointer pbVar5;
  char *in_stack_ffffffffffffffd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  this = (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
         CONCAT44(in_register_0000003c,type);
  name_01._M_str = coreName._M_str;
  name._M_str = in_stack_ffffffffffffffd0;
  name._M_len = (size_t)in_stack_ffffffffffffffc8;
  sVar4 = findCore(name);
  _Var3 = sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this->_M_ptr == (element_type *)0x0) {
    name_01._M_len = coreName._M_len & 0xffffffff;
    makeCore((CoreType)&_StackY_58,name_01);
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=(this,&_StackY_58);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_StackY_58._M_refcount);
    peVar1 = this->_M_ptr;
    local_48 = (pointer)*in_R8;
    pbStackY_40 = (pointer)in_R8[1];
    pbVar5 = (pointer)in_R8[2];
    *in_R8 = 0;
    in_R8[1] = 0;
    in_R8[2] = 0;
    (*peVar1->_vptr_Core[4])();
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    bVar2 = registerCore((shared_ptr<helics::Core> *)this,(CoreType)coreName._M_len);
    _Var3._M_pi = extraout_RDX;
    if (!bVar2) {
      name_00._M_str = in_stack_ffffffffffffffd0;
      name_00._M_len = (size_t)pbVar5;
      findCore(name_00);
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=(this,&_StackY_58);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_StackY_58._M_refcount);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<helics::Core>)
         sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    FindOrCreate(CoreType type, std::string_view coreName, std::vector<std::string> args)
{
    std::shared_ptr<Core> core = findCore(coreName);
    if (core) {
        return core;
    }
    core = makeCore(type, coreName);
    core->configureFromVector(std::move(args));

    if (!registerCore(core, type)) {
        core = findCore(coreName);
        if (core) {
            return core;
        }
    }

    return core;
}